

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ReadHuffmanCodeLengths
              (VP8LDecoder *dec,int *code_length_code_lengths,int num_symbols,int *code_lengths)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  byte *pbVar5;
  long in_RCX;
  int in_EDX;
  VP8LDecoder *in_RDI;
  int length;
  int repeat;
  int repeat_offset;
  int extra_bits;
  int slot;
  int use_prev;
  int code_len;
  HuffmanCode *p;
  int length_nbits;
  HuffmanTables tables;
  int prev_code_len;
  int max_symbol;
  int symbol;
  VP8LBitReader *br;
  int ok;
  int in_stack_00000364;
  int *in_stack_00000368;
  int in_stack_00000374;
  HuffmanTables *in_stack_00000378;
  HuffmanTables *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  VP8LBitReader *in_stack_ffffffffffffff58;
  VP8LBitReader *br_00;
  int local_98;
  long *local_50;
  uint local_44;
  int local_40;
  int local_3c;
  int local_2c;
  int local_4;
  
  local_2c = 0;
  local_44 = 8;
  iVar2 = VP8LHuffmanTablesAllocate(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if ((iVar2 != 0) &&
     (iVar2 = VP8LBuildHuffmanTable
                        (in_stack_00000378,in_stack_00000374,in_stack_00000368,in_stack_00000364),
     iVar2 != 0)) {
    uVar3 = VP8LReadBits(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    local_40 = in_EDX;
    if (uVar3 != 0) {
      VP8LReadBits(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
      uVar3 = VP8LReadBits(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
      local_40 = uVar3 + 2;
      if (in_EDX < local_40) goto LAB_00125b00;
    }
    local_3c = 0;
    while ((local_3c < in_EDX && (iVar2 = local_40 + -1, local_40 != 0))) {
      VP8LFillBitWindow((VP8LBitReader *)0x12598d);
      br_00 = (VP8LBitReader *)*local_50;
      uVar3 = VP8LPrefetchBits(&in_RDI->br);
      pbVar5 = (byte *)((long)&br_00->val + (ulong)(uVar3 & 0x7f) * 4);
      VP8LSetBitPos(&in_RDI->br,(in_RDI->br).bit_pos + (uint)*pbVar5);
      uVar4 = (uint)*(ushort *)(pbVar5 + 2);
      local_40 = iVar2;
      if (uVar4 < 0x10) {
        iVar2 = local_3c + 1;
        *(uint *)(in_RCX + (long)local_3c * 4) = uVar4;
        local_3c = iVar2;
        if (uVar4 != 0) {
          local_44 = uVar4;
        }
      }
      else {
        bVar1 = "\x03\x03\v"[(int)(uVar4 - 0x10)];
        uVar3 = VP8LReadBits(br_00,in_stack_ffffffffffffff54);
        local_98 = uVar3 + bVar1;
        if (in_EDX < local_3c + local_98) goto LAB_00125b00;
        in_stack_ffffffffffffff54 = local_44;
        if (uVar4 != 0x10) {
          in_stack_ffffffffffffff54 = 0;
        }
        while (0 < local_98) {
          *(uint *)(in_RCX + (long)local_3c * 4) = in_stack_ffffffffffffff54;
          local_98 = local_98 + -1;
          local_3c = local_3c + 1;
        }
      }
    }
    local_2c = 1;
  }
LAB_00125b00:
  VP8LHuffmanTablesDeallocate
            ((HuffmanTables *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (local_2c == 0) {
    local_4 = VP8LSetError(in_RDI,VP8_STATUS_BITSTREAM_ERROR);
  }
  else {
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int ReadHuffmanCodeLengths(
    VP8LDecoder* const dec, const int* const code_length_code_lengths,
    int num_symbols, int* const code_lengths) {
  int ok = 0;
  VP8LBitReader* const br = &dec->br;
  int symbol;
  int max_symbol;
  int prev_code_len = DEFAULT_CODE_LENGTH;
  HuffmanTables tables;

  if (!VP8LHuffmanTablesAllocate(1 << LENGTHS_TABLE_BITS, &tables) ||
      !VP8LBuildHuffmanTable(&tables, LENGTHS_TABLE_BITS,
                             code_length_code_lengths, NUM_CODE_LENGTH_CODES)) {
    goto End;
  }

  if (VP8LReadBits(br, 1)) {    // use length
    const int length_nbits = 2 + 2 * VP8LReadBits(br, 3);
    max_symbol = 2 + VP8LReadBits(br, length_nbits);
    if (max_symbol > num_symbols) {
      goto End;
    }
  } else {
    max_symbol = num_symbols;
  }

  symbol = 0;
  while (symbol < num_symbols) {
    const HuffmanCode* p;
    int code_len;
    if (max_symbol-- == 0) break;
    VP8LFillBitWindow(br);
    p = &tables.curr_segment->start[VP8LPrefetchBits(br) & LENGTHS_TABLE_MASK];
    VP8LSetBitPos(br, br->bit_pos + p->bits);
    code_len = p->value;
    if (code_len < kCodeLengthLiterals) {
      code_lengths[symbol++] = code_len;
      if (code_len != 0) prev_code_len = code_len;
    } else {
      const int use_prev = (code_len == kCodeLengthRepeatCode);
      const int slot = code_len - kCodeLengthLiterals;
      const int extra_bits = kCodeLengthExtraBits[slot];
      const int repeat_offset = kCodeLengthRepeatOffsets[slot];
      int repeat = VP8LReadBits(br, extra_bits) + repeat_offset;
      if (symbol + repeat > num_symbols) {
        goto End;
      } else {
        const int length = use_prev ? prev_code_len : 0;
        while (repeat-- > 0) code_lengths[symbol++] = length;
      }
    }
  }
  ok = 1;

 End:
  VP8LHuffmanTablesDeallocate(&tables);
  if (!ok) return VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
  return ok;
}